

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O3

char * ap_str_find_first_char_from_set(char *str,char *set)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = strlen(str);
  sVar2 = strlen(set);
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          if (str[sVar3] == set[sVar4]) {
            return str + sVar3;
          }
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar1);
  }
  return (char *)0x0;
}

Assistant:

char * ap_str_find_first_char_from_set (char *str, const char *set)
{
	size_t str_len;
	size_t set_len;
	size_t i;
	size_t j;

	str_len = strlen (str);
	set_len = strlen (set);

	for (i = 0; i < str_len; i ++)
	{
		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				return str + i;
			}
		}
	}

	return NULL;
}